

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::SetEntryToDeferParseForDebugger(FunctionBody *this)

{
  Attributes AVar1;
  int iVar2;
  ProxyEntryPointInfo *pPVar3;
  undefined4 extraout_var;
  char16 *pcVar4;
  wchar local_78 [4];
  char16 debugStringBuffer [42];
  ProxyEntryPointInfo *defaultEntryPointInfo;
  FunctionBody *this_local;
  
  pPVar3 = FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)this);
  if ((pPVar3->jsMethod != JavascriptFunction::DeferredParsingThunk) &&
     (pPVar3->jsMethod != ScriptContext::ProfileModeDeferredParsingThunk)) {
    if (((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->CurrentThunk ==
        ScriptContext::DebugProfileProbeThunk) {
      pPVar3->jsMethod = ScriptContext::ProfileModeDeferredParsingThunk;
    }
    else {
      pPVar3->jsMethod = JavascriptFunction::DeferredParsingThunk;
    }
    FunctionProxy::SetOriginalEntryPoint
              ((FunctionProxy *)this,JavascriptFunction::DeferredParsingThunk);
    AVar1 = FunctionProxy::GetAttributes((FunctionProxy *)this);
    FunctionProxy::SetAttributes((FunctionProxy *)this,AVar1 | DeferredParse);
  }
  ParseableFunctionInfo::SetStackNestedFunc(&this->super_ParseableFunctionInfo,false);
  FunctionProxy::SetAuxPtr<(Js::FunctionProxy::AuxPointerType)5,decltype(nullptr)>
            ((FunctionProxy *)this,(void *)0x0);
  ParseableFunctionInfo::SetReparsed(&this->super_ParseableFunctionInfo,true);
  if ((DAT_01ec73ca & 1) != 0) {
    iVar2 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    pcVar4 = FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_78);
    Output::Trace(DebuggerPhase,
                  L"Regenerate Due To Debug Mode: function %s (%s) from script context %p\n",
                  CONCAT44(extraout_var,iVar2),pcVar4,
                  (this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
  }
  UnlockCounters(this);
  return;
}

Assistant:

void FunctionBody::SetEntryToDeferParseForDebugger()
    {
        ProxyEntryPointInfo* defaultEntryPointInfo = this->GetDefaultEntryPointInfo();
        if (defaultEntryPointInfo->jsMethod != DefaultDeferredParsingThunk
#if defined(ENABLE_SCRIPT_PROFILING) || defined(ENABLE_SCRIPT_DEBUGGING)
            && defaultEntryPointInfo->jsMethod != ProfileDeferredParsingThunk
#endif
            )
        {
#if defined(ENABLE_SCRIPT_PROFILING) || defined(ENABLE_SCRIPT_DEBUGGING)
            // Just change the thunk, the cleanup will be done once the function gets called.
            if (this->m_scriptContext->CurrentThunk == ProfileEntryThunk)
            {
                defaultEntryPointInfo->jsMethod = ProfileDeferredParsingThunk;
            }
            else
#endif
            {
                defaultEntryPointInfo->jsMethod = DefaultDeferredParsingThunk;
            }

            this->SetOriginalEntryPoint(DefaultDeferredParsingThunk);
            this->SetAttributes((FunctionInfo::Attributes) (this->GetAttributes() | FunctionInfo::Attributes::DeferredParse));
        }

        // Set other state back to before parse as well
        this->SetStackNestedFunc(false);
        this->SetAuxPtr<AuxPointerType::StackNestedFuncParent>(nullptr);
        this->SetReparsed(true);
#if DBG
        char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        OUTPUT_VERBOSE_TRACE(Js::DebuggerPhase, _u("Regenerate Due To Debug Mode: function %s (%s) from script context %p\n"),
            this->GetDisplayName(), this->GetDebugNumberSet(debugStringBuffer), m_scriptContext);

        this->UnlockCounters(); // assuming background jit is stopped and allow the counter setters access again
#endif
    }